

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O2

void duckdb::ListSelectFunction<duckdb::SetSelectionVectorWhere>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t selection_offset;
  bool bVar1;
  reference this;
  reference this_00;
  Vector *this_01;
  Vector *pVVar2;
  ulong uVar3;
  InvalidInputException *this_02;
  idx_t iVar4;
  idx_t row_idx;
  ulong selection_idx;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  allocator local_229;
  idx_t offset;
  Vector *local_220;
  idx_t result_length;
  TemplatedValidityMask<unsigned_long> *local_210;
  Vector *local_208;
  idx_t local_200;
  DataChunk *local_1f8;
  list_entry_t *local_1f0;
  Vector *local_1e8;
  data_ptr_t local_1e0;
  data_ptr_t local_1d8;
  long *local_1d0;
  idx_t local_1c8;
  ValidityMask *local_1c0;
  idx_t local_1b8;
  idx_t local_1b0;
  ValidityMask entry_validity_mask;
  SelectionVector result_selection_vec;
  UnifiedVectorFormat input_list;
  UnifiedVectorFormat selection_lists;
  Value local_d8;
  Vector local_98;
  
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  this_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  iVar7 = args->count;
  local_1d8 = result->data;
  local_208 = result;
  local_1f8 = args;
  local_220 = ListVector::GetEntry(result);
  UnifiedVectorFormat::UnifiedVectorFormat(&selection_lists);
  local_200 = iVar7;
  Vector::ToUnifiedFormat(this_00,iVar7,&selection_lists);
  local_1f0 = (list_entry_t *)selection_lists.data;
  this_01 = ListVector::GetEntry(this_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&input_list);
  iVar7 = local_200;
  Vector::ToUnifiedFormat(this,local_200,&input_list);
  local_1e0 = input_list.data;
  pVVar2 = ListVector::GetEntry(this);
  FlatVector::VerifyFlatVector(pVVar2);
  result_length = 0;
  local_1c0 = &pVVar2->validity;
  local_1e8 = pVVar2;
  for (uVar5 = 0; pVVar2 = local_208, iVar7 != uVar5; uVar5 = uVar5 + 1) {
    uVar3 = uVar5;
    if ((input_list.sel)->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)(input_list.sel)->sel_vector[uVar5];
    }
    selection_idx = uVar5;
    if ((selection_lists.sel)->sel_vector != (sel_t *)0x0) {
      selection_idx = (ulong)(selection_lists.sel)->sel_vector[uVar5];
    }
    if (((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) ||
        ((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6]
          >> (uVar3 & 0x3f) & 1) != 0)) &&
       ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0 ||
        ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
          [selection_idx >> 6] >> (selection_idx & 0x3f) & 1) != 0)))) {
      Vector::Vector(&local_98,this_01);
      SetSelectionVectorWhere::GetResultLength
                (local_1f8,&result_length,local_1f0,&local_98,selection_idx);
      Vector::~Vector(&local_98);
    }
  }
  ListVector::Reserve(local_208,result_length);
  SelectionVector::SelectionVector(&result_selection_vec,result_length);
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.capacity = result_length;
  FlatVector::VerifyFlatVector(pVVar2);
  local_210 = &(pVVar2->validity).super_TemplatedValidityMask<unsigned_long>;
  offset = 0;
  row_idx = 0;
  do {
    if (row_idx == iVar7) {
      Vector::Slice(local_220,local_1e8,&result_selection_vec,iVar7);
      Vector::Flatten(local_220,offset);
      ListVector::SetListSize(pVVar2,offset);
      FlatVector::SetValidity(local_220,&entry_validity_mask);
      bVar1 = DataChunk::AllConstant(local_1f8);
      Vector::SetVectorType(pVVar2,bVar1 * '\x02');
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&result_selection_vec.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&input_list);
      UnifiedVectorFormat::~UnifiedVectorFormat(&selection_lists);
      return;
    }
    iVar6 = row_idx;
    if ((selection_lists.sel)->sel_vector != (sel_t *)0x0) {
      iVar6 = (idx_t)(selection_lists.sel)->sel_vector[row_idx];
    }
    if ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
         [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) {
      iVar4 = row_idx;
      if ((input_list.sel)->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)(input_list.sel)->sel_vector[row_idx];
      }
      selection_offset = local_1f0[iVar6].offset;
      local_1b0 = local_1f0[iVar6].length;
      if ((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6]
           >> (iVar4 & 0x3f) & 1) != 0)) {
        local_1b8 = *(idx_t *)(local_1e0 + iVar4 * 0x10);
        iVar7 = *(idx_t *)(local_1e0 + iVar4 * 0x10 + 8);
        local_1d0 = (long *)(local_1d8 + row_idx * 0x10);
        *(idx_t *)(local_1d8 + row_idx * 0x10) = offset;
        local_1c8 = row_idx;
        for (iVar6 = 0; local_1b0 != iVar6; iVar6 = iVar6 + 1) {
          Vector::GetValue(&local_d8,this_01,iVar6 + selection_offset);
          bVar1 = local_d8.is_null;
          Value::~Value(&local_d8);
          if (bVar1 == true) {
            this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_d8,
                       "NULLs are not allowed as list elements in the second input parameter.",
                       &local_229);
            InvalidInputException::InvalidInputException(this_02,(string *)&local_d8);
            __cxa_throw(this_02,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          SetSelectionVectorWhere::SetSelectionVector
                    (&result_selection_vec,&entry_validity_mask,local_1c0,this_01,iVar6,&offset,
                     selection_offset,local_1b8,iVar7);
        }
        local_1d0[1] = offset - *local_1d0;
        row_idx = local_1c8;
        pVVar2 = local_208;
        iVar7 = local_200;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid(local_210,row_idx);
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid(local_210,row_idx);
    }
    row_idx = row_idx + 1;
  } while( true );
}

Assistant:

static void ListSelectFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.data.size() == 2);
	Vector &list = args.data[0];
	Vector &selection_list = args.data[1];
	idx_t count = args.size();

	list_entry_t *result_data;
	result_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_entry = ListVector::GetEntry(result);

	UnifiedVectorFormat selection_lists;
	selection_list.ToUnifiedFormat(count, selection_lists);
	auto selection_lists_data = UnifiedVectorFormat::GetData<list_entry_t>(selection_lists);
	auto &selection_entry = ListVector::GetEntry(selection_list);

	UnifiedVectorFormat input_list;
	list.ToUnifiedFormat(count, input_list);
	auto input_lists_data = UnifiedVectorFormat::GetData<list_entry_t>(input_list);
	auto &input_entry = ListVector::GetEntry(list);
	auto &input_validity = FlatVector::Validity(input_entry);

	idx_t result_length = 0;
	for (idx_t i = 0; i < count; i++) {
		idx_t input_idx = input_list.sel->get_index(i);
		idx_t selection_idx = selection_lists.sel->get_index(i);
		if (input_list.validity.RowIsValid(input_idx) && selection_lists.validity.RowIsValid(selection_idx)) {
			OP::GetResultLength(args, result_length, selection_lists_data, selection_entry, selection_idx);
		}
	}

	ListVector::Reserve(result, result_length);
	SelectionVector result_selection_vec = SelectionVector(result_length);
	ValidityMask entry_validity_mask = ValidityMask(result_length);
	ValidityMask &result_validity_mask = FlatVector::Validity(result);

	idx_t offset = 0;
	for (idx_t j = 0; j < count; j++) {
		// Get length and offset of selection list for current output row
		auto selection_list_idx = selection_lists.sel->get_index(j);
		idx_t selection_len = 0;
		idx_t selection_offset = 0;
		if (selection_lists.validity.RowIsValid(selection_list_idx)) {
			selection_len = selection_lists_data[selection_list_idx].length;
			selection_offset = selection_lists_data[selection_list_idx].offset;
		} else {
			result_validity_mask.SetInvalid(j);
			continue;
		}
		// Get length and offset of input list for current output row
		auto input_list_idx = input_list.sel->get_index(j);
		idx_t input_length = 0;
		idx_t input_offset = 0;
		if (input_list.validity.RowIsValid(input_list_idx)) {
			input_length = input_lists_data[input_list_idx].length;
			input_offset = input_lists_data[input_list_idx].offset;
		} else {
			result_validity_mask.SetInvalid(j);
			continue;
		}
		result_data[j].offset = offset;
		// Set all selected values in the result
		for (idx_t child_idx = 0; child_idx < selection_len; child_idx++) {
			if (selection_entry.GetValue(selection_offset + child_idx).IsNull()) {
				throw InvalidInputException("NULLs are not allowed as list elements in the second input parameter.");
			}
			OP::SetSelectionVector(result_selection_vec, entry_validity_mask, input_validity, selection_entry,
			                       child_idx, offset, selection_offset, input_offset, input_length);
		}
		result_data[j].length = offset - result_data[j].offset;
	}
	result_entry.Slice(input_entry, result_selection_vec, count);
	result_entry.Flatten(offset);
	ListVector::SetListSize(result, offset);
	FlatVector::SetValidity(result_entry, entry_validity_mask);
	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
}